

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbifnet.cpp
# Opt level: O1

void __thiscall
HttpReqThread::post_result(HttpReqThread *this,int status,CVmDataSource *reply,char *hdrs,char *loc)

{
  vm_globalvar_t *pvVar1;
  TadsMessage *this_00;
  
  this_00 = (TadsMessage *)operator_new(0x68);
  pvVar1 = this->idg;
  TadsMessage::TadsMessage(this_00,"TadsEventMessage",(OS_Event *)0x0);
  (this_00->super_CVmRefCntObj)._vptr_CVmRefCntObj = (_func_int **)&PTR__TadsHttpReqResult_00351f70;
  this_00[1].super_CVmRefCntObj._vptr_CVmRefCntObj = (_func_int **)0x0;
  this_00[1].super_CVmRefCntObj.cnt.cnt.super___atomic_base<long>._M_i = (__int_type)pvVar1;
  *(int *)&this_00[1].typ = status;
  this_00[1].nxt = (TadsMessage *)reply;
  this_00[1].ev = (OS_Event *)hdrs;
  this_00[1].quit_evt = (OS_Event *)loc;
  TadsMessageQueue::post(this->queue,this_00);
  this->idg = (vm_globalvar_t *)0x0;
  return;
}

Assistant:

void post_result(int status, CVmDataSource *reply, char *hdrs, char *loc)
    {
        /* establish the global context */
        VMGLOB_PTR(vmg);

        /* create the result event */
        TadsHttpReqResult *evt = new TadsHttpReqResult(
            vmg_ idg, status, reply, hdrs, loc);

        /* post the event (this transfers ownership to the queue) */
        queue->post(evt);

        /* the result event now owns our ID global 'idg', so forget it */
        idg = 0;
    }